

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O2

duk_ret_t dukglue::detail::
          FuncInfoHolder<Shape_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          ::FuncRuntime::call_native_function(duk_context *ctx)

{
  _func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *funcToCall;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_40;
  
  duk_push_current_function(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_dfc3);
  funcToCall = (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                *)duk_require_pointer(ctx,-1);
  if (funcToCall !=
      (_func_Shape_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)0x0)
  {
    duk_pop_2(ctx);
    get_stack_values_helper<std::__cxx11::string_const&,0ul>(&local_40,(detail *)ctx);
    FuncInfoHolder<Shape*,std::__cxx11::string_const&>::FuncRuntime::
    actually_call<Shape*,std::__cxx11::string>(ctx,funcToCall,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    return 1;
  }
  duk_error_raw(ctx,-6,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_function.h"
                ,0x41,"what even");
}

Assistant:

static duk_ret_t call_native_function(duk_context* ctx)
				{
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "func_ptr");
					void* fp_void = duk_require_pointer(ctx, -1);
					if (fp_void == NULL) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "what even");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

          static_assert(sizeof(RetType(*)(Ts...)) == sizeof(void*), "Function pointer and data pointer are different sizes");
					RetType(*funcToCall)(Ts...) = reinterpret_cast<RetType(*)(Ts...)>(fp_void);

					actually_call(ctx, funcToCall, dukglue::detail::get_stack_values<Ts...>(ctx));
					return std::is_void<RetType>::value ? 0 : 1;
				}